

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector_test.cc
# Opt level: O3

void __thiscall
fizplex::SVectorTest_EmptyHasZeolength_Test::TestBody(SVectorTest_EmptyHasZeolength_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *in_R9;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  string local_38;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  SVector::SVector((SVector *)&local_38);
  sVar2 = SVector::length((SVector *)&local_38);
  local_18[0] = (internal)(sVar2 == 0);
  local_10.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_38._M_dataplus._M_p,
                    local_38.field_2._M_allocated_capacity - (long)local_38._M_dataplus._M_p);
  }
  if (sVar2 != 0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_18,(AssertionResult *)"SVector().length() == 0","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,6,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(SVectorTest, EmptyHasZeolength) { EXPECT_TRUE(SVector().length() == 0); }